

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O2

void __thiscall breakpoint_recorder::reset(breakpoint_recorder *this)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  forward_list<breakpoint_recorder::breakpoint,_std::allocator<breakpoint_recorder::breakpoint>_>
  *__range2;
  breakpoint_recorder *pbVar3;
  iterator __begin1;
  iterator local_28;
  
  local_28 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
             ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
                      *)&this->m_pending);
  pcVar1 = (this->m_pending).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
           .ctrl_;
  sVar2 = (this->m_pending).
          super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
          .
          super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
          .capacity_;
  do {
    if (local_28.ctrl_ == pcVar1 + sVar2) {
      return;
    }
    *(undefined1 *)((long)local_28.field_1.slot_ + 0x28) = 1;
    pbVar3 = this;
    do {
      pbVar3 = *(breakpoint_recorder **)&pbVar3->m_breakpoints;
      if (pbVar3 == (breakpoint_recorder *)0x0) goto LAB_0012466d;
    } while (*(long *)&(pbVar3->m_pending).
                       super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
             != *(long *)((long)local_28.field_1.slot_ + 0x20));
    variant_impl::variant<unsigned_long,std::__cxx11::string,cs_impl::any>::
    emplace<std::__cxx11::string,std::__cxx11::string_const&>
              ((variant<unsigned_long,std::__cxx11::string,cs_impl::any> *)
               ((long)&pbVar3->m_pending + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_28.field_1.slot_);
LAB_0012466d:
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
    ::iterator::operator++(&local_28);
  } while( true );
}

Assistant:

void reset()
	{
		for (auto &it: m_pending) {
			it.second.second = true;
			for (auto &b: m_breakpoints) {
				if (b.id == it.second.first) {
					b.data.emplace<std::string>(it.first);
					break;
				}
			}
		}
	}